

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Node * prvTidyInferredTag(TidyDocImpl *doc,TidyTagId id)

{
  Lexer *pLVar1;
  Node *pNVar2;
  Dict *pDVar3;
  tmbstr ptVar4;
  
  pLVar1 = doc->lexer;
  pNVar2 = (Node *)(*pLVar1->allocator->vtbl->alloc)(pLVar1->allocator,0x68);
  pNVar2->parent = (Node *)0x0;
  pNVar2->prev = (Node *)0x0;
  pNVar2->next = (Node *)0x0;
  pNVar2->content = (Node *)0x0;
  pNVar2->last = (Node *)0x0;
  pNVar2->attributes = (AttVal *)0x0;
  pNVar2->was = (Dict *)0x0;
  pNVar2->tag = (Dict *)0x0;
  pNVar2->element = (tmbstr)0x0;
  pNVar2->start = 0;
  pNVar2->end = 0;
  pNVar2->type = RootNode;
  pNVar2->line = 0;
  pNVar2->column = 0;
  pNVar2->closed = no;
  pNVar2->implicit = no;
  pNVar2->linebreak = no;
  if (pLVar1 != (Lexer *)0x0) {
    pNVar2->line = pLVar1->lines;
    pNVar2->column = pLVar1->columns;
  }
  pNVar2->type = TextNode;
  pDVar3 = prvTidyLookupTagDef(id);
  if (pDVar3 != (Dict *)0x0) {
    pNVar2->type = StartTag;
    pNVar2->implicit = yes;
    ptVar4 = prvTidytmbstrdup(doc->allocator,pDVar3->name);
    pNVar2->element = ptVar4;
    pNVar2->tag = pDVar3;
    pNVar2->start = pLVar1->txtstart;
    pNVar2->end = pLVar1->txtend;
    return pNVar2;
  }
  __assert_fail("dict != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/lexer.c"
                ,0x890,"Node *prvTidyInferredTag(TidyDocImpl *, TidyTagId)");
}

Assistant:

Node* TY_(InferredTag)(TidyDocImpl* doc, TidyTagId id)
{
    Lexer *lexer = doc->lexer;
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    const Dict* dict = TY_(LookupTagDef)(id);

    assert( dict != NULL );

    node->type = StartTag;
    node->implicit = yes;
    node->element = TY_(tmbstrdup)(doc->allocator, dict->name);
    node->tag = dict;
    node->start = lexer->txtstart;
    node->end = lexer->txtend;

    return node;
}